

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontStructMatrix.cpp
# Opt level: O1

void __thiscall
TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
::Assemble(TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixTBBFlow<std::complex<double>_>_>
           *this,TPZBaseMatrix *stiff_base,TPZBaseMatrix *rhs_base,
          TPZAutoPointer<TPZGuiInterface> *guiInterface)

{
  TPZCompMesh *mesh;
  TPZCompEl *el;
  _Base_ptr p_Var1;
  int iVar2;
  long lVar3;
  int64_t size;
  TPZCompEl **ppTVar4;
  long *plVar5;
  ostream *poVar6;
  _Rb_tree_header *p_Var7;
  _Rb_tree_header *p_Var8;
  long lVar9;
  long nelem;
  long lVar10;
  TPZVec<int> elorder;
  TPZElementMatrixT<std::complex<double>_> ef;
  TPZElementMatrixT<std::complex<double>_> ek;
  int iStack_10414;
  _Rb_tree_header *p_Stack_10410;
  TPZCompMesh *pTStack_10408;
  TPZFMatrix<std::complex<double>_> *pTStack_10400;
  TPZMatrix<std::complex<double>_> *pTStack_103f8;
  TPZVec<int> TStack_103f0;
  TPZElementMatrixT<std::complex<double>_> TStack_103d0;
  TPZElementMatrixT<std::complex<double>_> local_8200;
  
  lVar3 = __dynamic_cast(stiff_base,&TPZBaseMatrix::typeinfo,
                         &TPZMatrix<std::complex<double>>::typeinfo,0);
  if ((lVar3 == 0) ||
     (lVar3 = __dynamic_cast(rhs_base,&TPZBaseMatrix::typeinfo,
                             &TPZFMatrix<std::complex<double>>::typeinfo,0), lVar3 != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "virtual void TPZFrontStructMatrix<TPZFrontNonSym<std::complex<double>>, std::complex<double>, TPZStructMatrixTBBFlow<CSTATE>>::Assemble(TPZBaseMatrix &, TPZBaseMatrix &, TPZAutoPointer<TPZGuiInterface>) [TFront = TPZFrontNonSym<std::complex<double>>, TVar = std::complex<double>, TPar = TPZStructMatrixTBBFlow<CSTATE>]"
               ,0x13e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," incompatible types. Aborting...\n",0x21);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/TPZFrontStructMatrix.cpp"
               ,0x145);
  }
  pTStack_103f8 =
       (TPZMatrix<std::complex<double>_> *)
       __dynamic_cast(stiff_base,&TPZBaseMatrix::typeinfo,&TPZMatrix<std::complex<double>>::typeinfo
                      ,0);
  if ((pTStack_103f8 == (TPZMatrix<std::complex<double>_> *)0x0) ||
     (pTStack_10400 =
           (TPZFMatrix<std::complex<double>_> *)
           __dynamic_cast(rhs_base,&TPZBaseMatrix::typeinfo,
                          &TPZFMatrix<std::complex<double>>::typeinfo,0),
     pTStack_10400 == (TPZFMatrix<std::complex<double>_> *)0x0)) {
    __cxa_bad_cast();
  }
  mesh = (this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.fMesh;
  lVar3 = (mesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  TPZElementMatrixT<std::complex<double>_>::TPZElementMatrixT(&local_8200,mesh,EK);
  TPZElementMatrixT<std::complex<double>_>::TPZElementMatrixT
            (&TStack_103d0,
             (this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.fMesh,EF);
  pTStack_10408 = (this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.fMesh;
  size = TPZCompMesh::NEquations(pTStack_10408);
  iStack_10414 = 0;
  TPZVec<int>::TPZVec(&TStack_103f0,size,&iStack_10414);
  OrderElement(this);
  if (0 < lVar3) {
    pTStack_10408 = (TPZCompMesh *)&pTStack_10408->fElementVec;
    p_Stack_10410 =
         &(this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.fMaterialIds.
          _M_t._M_impl.super__Rb_tree_header;
    lVar10 = 0;
    lVar9 = 0;
    do {
      nelem = (long)(this->fElementOrder).fStore[lVar10];
      if (-1 < nelem) {
        ppTVar4 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                            ((TPZChunkVector<TPZCompEl_*,_10> *)pTStack_10408,nelem);
        el = *ppTVar4;
        if (el != (TPZCompEl *)0x0) {
          plVar5 = (long *)(**(code **)(*(long *)el + 0xb8))(el);
          if ((plVar5 != (long *)0x0) &&
             (iVar2 = (**(code **)(*plVar5 + 0x58))(plVar5),
             (int)(this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.
                  fMaterialIds._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
            p_Var7 = p_Stack_10410;
            for (p_Var1 = *(_Base_ptr *)
                           ((long)&(this->super_TPZStructMatrixT<std::complex<double>_>).
                                   super_TPZStructMatrix.fMaterialIds._M_t._M_impl.
                                   super__Rb_tree_header._M_header + 8);
                (_Rb_tree_header *)p_Var1 != (_Rb_tree_header *)0x0;
                p_Var1 = (&p_Var1->_M_left)[(int)*(size_t *)(p_Var1 + 1) < iVar2]) {
              if (iVar2 <= (int)*(size_t *)(p_Var1 + 1)) {
                p_Var7 = (_Rb_tree_header *)p_Var1;
              }
            }
            p_Var8 = p_Stack_10410;
            if ((p_Var7 != p_Stack_10410) && (p_Var8 = p_Var7, iVar2 < (int)p_Var7->_M_node_count))
            {
              p_Var8 = p_Stack_10410;
            }
            if (p_Var8 == p_Stack_10410) goto LAB_01396cd1;
          }
          (**(code **)(*(long *)el + 0x110))(el,&local_8200,&TStack_103d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout," assemblando elemento frontal ",0x1e);
          poVar6 = std::ostream::_M_insert<long>((long)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          AssembleElement(this,el,&local_8200.super_TPZElementMatrix,
                          &TStack_103d0.super_TPZElementMatrix,pTStack_103f8,pTStack_10400);
          if (this->f_quiet == 0) {
            iStack_10414 = CONCAT31(iStack_10414._1_3_,0x2a);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(char *)&iStack_10414,1);
            if ((lVar9 * -0x3333333333333333 + 0x1999999999999998U >> 2 |
                lVar9 * -0x3333333333333333 << 0x3e) < 0xccccccccccccccd) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
              poVar6 = std::ostream::_M_insert<long>((long)&std::cout);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar6,"% Elements assembled ",0x15);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
              std::ostream::put((char)poVar6);
              std::ostream::flush();
              std::ostream::flush();
            }
          }
          lVar9 = lVar9 + 1;
        }
      }
LAB_01396cd1:
      lVar10 = lVar10 + 1;
    } while (lVar10 != lVar3);
  }
  TStack_103f0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  if (TStack_103f0.fStore != (int *)0x0) {
    operator_delete__(TStack_103f0.fStore);
  }
  TStack_103d0.super_TPZElementMatrix._vptr_TPZElementMatrix =
       (_func_int **)&PTR__TPZElementMatrixT_0194d820;
  TPZBlock::~TPZBlock(&TStack_103d0.fConstrBlock);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix
            (&TStack_103d0.fConstrMat.super_TPZFMatrix<std::complex<double>_>,&PTR_PTR_01887fd8);
  TPZBlock::~TPZBlock(&TStack_103d0.fBlock);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix
            (&TStack_103d0.fMat.super_TPZFMatrix<std::complex<double>_>,&PTR_PTR_01887fd8);
  TPZElementMatrix::~TPZElementMatrix(&TStack_103d0.super_TPZElementMatrix);
  local_8200.super_TPZElementMatrix._vptr_TPZElementMatrix =
       (_func_int **)&PTR__TPZElementMatrixT_0194d820;
  TPZBlock::~TPZBlock(&local_8200.fConstrBlock);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix
            (&local_8200.fConstrMat.super_TPZFMatrix<std::complex<double>_>,&PTR_PTR_01887fd8);
  TPZBlock::~TPZBlock(&local_8200.fBlock);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix
            (&local_8200.fMat.super_TPZFMatrix<std::complex<double>_>,&PTR_PTR_01887fd8);
  TPZElementMatrix::~TPZElementMatrix(&local_8200.super_TPZElementMatrix);
  return;
}

Assistant:

void TPZFrontStructMatrix<TFront,TVar,TPar>::Assemble(TPZBaseMatrix & stiff_base, TPZBaseMatrix & rhs_base, TPZAutoPointer<TPZGuiInterface> guiInterface){
    if(!dynamic_cast<TPZMatrix<TVar>*>(&stiff_base) ||
       dynamic_cast<TPZFMatrix<TVar>*>(&rhs_base)){
        PZError<<__PRETTY_FUNCTION__;
        PZError<<" incompatible types. Aborting...\n";
        DebugStop();
    }
	auto& stiffness = dynamic_cast<TPZMatrix<TVar>&>(stiff_base);
    auto& rhs = dynamic_cast<TPZFMatrix<TVar>&>(rhs_base);
	int64_t iel;
	int64_t numel = 0, nelem = this->fMesh->NElements();
	TPZElementMatrixT<TVar> ek(this->fMesh,TPZElementMatrix::EK),ef(this->fMesh,TPZElementMatrix::EF);
	
	TPZAdmChunkVector<TPZCompEl *> &elementvec = this->fMesh->ElementVec();
	
	
	/**Rearange elements order*/
	TPZVec<int> elorder(this->fMesh->NEquations(),0);
	
	OrderElement();
	
	for(iel=0; iel < nelem; iel++) {
		
        int64_t elindex = fElementOrder[iel];
		if(elindex < 0) continue;
		TPZCompEl *el = elementvec[elindex];
		if(!el) continue;
		TPZMaterial * mat = el->Material();
		if(mat)
		{
			int matid = mat->Id();
			if(this->ShouldCompute(matid) == false)
			{
				continue;
			}
		}
		else
		{
		}
		
		//		int dim = el->NumNodes();
		
		//Builds elements stiffness matrix
		el->CalcStiff(ek,ef);
		
		
		std::cout<< " assemblando elemento frontal " << iel <<std::endl;
		
#ifdef PZ_LOG
        if (logger.isDebugEnabled())
		{
			std::stringstream sout;
			ek.fMat.Print("Element stiffness Frontal",sout);
			LOGPZ_DEBUG(logger,sout.str())
		}
#endif
		
		AssembleElement(el, ek, ef, stiffness, rhs);
#ifdef PZ_LOG
		if(loggerel.isDebugEnabled())
		{
			std::stringstream sout;
			ek.fMat.Print("Element stiffness depois de assemblada ",sout);
			LOGPZ_DEBUG(loggerel,sout.str())
		}
#endif
		
		if(!f_quiet)
		{
			cout << '*';
			if(!(numel%20)) {
				cout << " " << (100*iel/nelem) << "% Elements assembled " << endl;
				cout.flush();
			}
		}
		numel++;
		
	}//fim for iel
	
}